

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O3

optional<sai::VirtualFileEntry> * __thiscall
sai::VirtualFileSystem::GetEntry
          (optional<sai::VirtualFileEntry> *__return_storage_ptr__,VirtualFileSystem *this,
          char *Path)

{
  int iVar1;
  char *__s1;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  bool bVar5;
  string CurPath;
  VirtualPage CurPage;
  VirtualPage TablePage;
  long *local_2050 [2];
  long local_2040 [2];
  int local_2030 [1024];
  allocator<char> local_1030 [4];
  uint auStack_102c [1023];
  
  uVar2 = 0;
  memset(local_2030,0,0x1000);
  std::istream::seekg((long)(this->FileStream).
                            super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      0x2000);
  std::istream::read((char *)(this->FileStream).
                             super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)local_2030);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2050,Path,local_1030);
  __s1 = strtok((char *)local_2050[0],"./");
LAB_001042e7:
  if (__s1 != (char *)0x0) {
    bVar5 = uVar2 != 0;
    do {
      lVar3 = 0x40;
      piVar4 = local_2030;
      while( true ) {
        if (*piVar4 == 0) goto LAB_00104411;
        iVar1 = strcmp(__s1,(char *)(piVar4 + 1));
        if (iVar1 == 0) {
          __s1 = strtok((char *)0x0,"./");
          if (__s1 == (char *)0x0) {
            bVar5 = true;
            std::_Optional_payload_base<sai::VirtualFileEntry>::
            _Storage<sai::VirtualFileEntry,false>::
            _Storage<std::shared_ptr<sai::ifstream>&,sai::FATEntry&>
                      ((_Storage<sai::VirtualFileEntry,false> *)__return_storage_ptr__,this,piVar4);
            goto LAB_00104418;
          }
          if (*(char *)((long)piVar4 + 0x26) != '\x10') goto LAB_00104411;
          uVar2 = (ulong)(uint)piVar4[10];
          std::istream::seekg((long)(this->FileStream).
                                    super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,piVar4[10] << 0xc);
          std::istream::read((char *)(this->FileStream).
                                     super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr,(long)local_2030);
          goto LAB_001042e7;
        }
        if (!(bool)(lVar3 != 1 | ~bVar5 & 1U)) break;
        piVar4 = piVar4 + 0x10;
        lVar3 = lVar3 + -1;
        if (lVar3 == 0) goto LAB_00104411;
      }
      memset(local_1030,0,0x1000);
      std::istream::seekg((long)(this->FileStream).
                                super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,((uint)uVar2 & 0xfffffe00) << 0xc);
      std::istream::read((char *)(this->FileStream).
                                 super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,(long)local_1030);
      lVar3 = uVar2 * 2;
      uVar2 = (ulong)auStack_102c[lVar3];
      if (uVar2 == 0) break;
      std::istream::seekg((long)(this->FileStream).
                                super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,auStack_102c[lVar3] << 0xc);
      std::istream::read((char *)(this->FileStream).
                                 super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,(long)local_2030);
      bVar5 = true;
    } while (__s1 != (char *)0x0);
  }
LAB_00104411:
  bVar5 = false;
LAB_00104418:
  (__return_storage_ptr__->super__Optional_base<sai::VirtualFileEntry,_false,_false>)._M_payload.
  super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
  super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged = bVar5;
  if (local_2050[0] != local_2040) {
    operator_delete(local_2050[0],local_2040[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<VirtualFileEntry> VirtualFileSystem::GetEntry(const char* Path)
{
	VirtualPage CurPage = {};
	Read(2 * VirtualPage::PageSize, CurPage);

	std::string CurPath(Path);
	const char* PathDelim    = "./";
	const char* CurToken     = std::strtok(&CurPath[0], PathDelim);
	std::size_t CurEntry     = 0;
	std::size_t CurPageIndex = 0;

	while( CurEntry < 64 && CurPage.FATEntries[CurEntry].Flags && CurToken )
	{
		if( std::strcmp(CurToken, CurPage.FATEntries[CurEntry].Name) == 0 )
		{
			// Match
			if( (CurToken = std::strtok(nullptr, PathDelim)) == nullptr )
			{
				// No more tokens, done
				return std::make_optional<VirtualFileEntry>(
					FileStream, CurPage.FATEntries[CurEntry]
				);
			}
			// Try to go further
			if( CurPage.FATEntries[CurEntry].Type != FATEntry::EntryType::Folder )
			{
				// Part of the path was not a folder, cant go further
				return std::nullopt;
			}

			const std::uint32_t PageIndex = CurPage.FATEntries[CurEntry].PageIndex;
			Read(PageIndex * VirtualPage::PageSize, CurPage);
			CurEntry     = 0;
			CurPageIndex = PageIndex;
			continue;
		}

		// Last entry ( of this Page ), check if there are more after this.
		if( CurEntry == 63 && CurPageIndex )
		{
			// If a folder has more than 64 `FATEntries`, the `NextPageIndex`
			// field on the `PageEntry` will indicate on what `Page` the extra
			// entries are located.
			VirtualPage TablePage = {};
			Read(VirtualPage::NearestTableIndex(CurPageIndex) * VirtualPage::PageSize, TablePage);

			const std::uint32_t NextPageIndex = TablePage.PageEntries[CurPageIndex].NextPageIndex;
			if( NextPageIndex )
			{
				Read(NextPageIndex * VirtualPage::PageSize, CurPage);
				CurEntry     = 0;
				CurPageIndex = NextPageIndex;
				continue;
			}
		}

		CurEntry++;
	}

	return std::nullopt;
}